

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.cpp
# Opt level: O0

int main(void)

{
  long lVar1;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  int local_50;
  int local_4c;
  int pos;
  value<int> m;
  layout *l;
  graphic g;
  
  mtrace();
  graphic::graphic((graphic *)&l);
  lVar1 = mpt::graphic::create_layout();
  local_4c = 0;
  mpt::metatype::value<int>::value((value<int> *)&pos,&local_4c);
  mpt::logger::default_instance();
  mpt::object::set((char *)(lVar1 + 0x18),"name",(logger *)"lay");
  local_50 = mpt::graphic::add_layout((layout *)&l,SUB81(lVar1,0));
  mpt::graphic::hint::hint((hint *)&local_54,local_50,4,3);
  graphic::register_update((graphic *)&l,lVar1,local_54);
  mpt::graphic::hint::hint((hint *)&local_58,local_50,6,8);
  graphic::register_update((graphic *)&l,lVar1,local_58);
  mpt::graphic::hint::hint((hint *)&local_5c,local_50,4,-1);
  graphic::register_update((graphic *)&l,lVar1,local_5c);
  mpt::graphic::hint::hint((hint *)&local_60,local_50,4,-1);
  graphic::register_update((graphic *)&l,&pos,local_60);
  graphic::dispatch_updates((graphic *)&l);
  mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::compress
            ((updates<const_mpt::convertable_*,_mpt::graphic::hint> *)&g.field_0x8,0);
  mpt::graphic::remove_layout((layout *)&l);
  mpt::metatype::value<int>::~value((value<int> *)&pos);
  graphic::~graphic((graphic *)&l);
  return 0;
}

Assistant:

int main()
{
	mtrace();
	
	graphic g;
	
	mpt::layout *l = g.create_layout();
	mpt::metatype::value<int> m(0);
	
	l->set("name", "lay");
	
	int pos = g.add_layout(l);
	g.register_update(l,  mpt::graphic::hint(pos, 4, 3));
	g.register_update(l,  mpt::graphic::hint(pos, 6, 8)); // unique hint
	g.register_update(l,  mpt::graphic::hint(pos, 4));    // overrides specific entry
	g.register_update(&m, mpt::graphic::hint(pos, 4));    // different data value
	
	g.dispatch_updates();
	g.compress();
	
	g.remove_layout(l);
}